

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

Options * __thiscall ApprovalTests::Options::withScrubber(Options *this,Scrubber *scrubber)

{
  shared_ptr<ApprovalTests::ApprovalNamer> *in_RDX;
  long in_RSI;
  Options *in_RDI;
  FileOptions *in_stack_ffffffffffffff38;
  Options *reporter;
  Scrubber *scrubber_00;
  FileOptions *fileOptions;
  Options *this_00;
  undefined1 local_60 [96];
  
  scrubber_00 = (Scrubber *)(local_60 + 0x20);
  reporter = in_RDI;
  FileOptions::FileOptions(&in_RDI->fileOptions_,in_stack_ffffffffffffff38);
  fileOptions = (FileOptions *)local_60;
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_RDI,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffff38);
  this_00 = *(Options **)(in_RSI + 0x48);
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)in_RDI,
             (shared_ptr<ApprovalTests::ApprovalNamer> *)in_stack_ffffffffffffff38);
  Options(this_00,fileOptions,scrubber_00,(Reporter *)reporter,SUB81((ulong)in_RSI >> 0x38,0),in_RDX
         );
  ::std::shared_ptr<ApprovalTests::ApprovalNamer>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)0x11d012);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x11d01c);
  FileOptions::~FileOptions((FileOptions *)0x11d029);
  return in_RDI;
}

Assistant:

Options Options::withScrubber(Scrubber scrubber) const
    {
        return Options(fileOptions_, std::move(scrubber), reporter_, false, namer_);
    }